

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool ClipperLib::PointInPolygon(IntPoint *pt,OutPt *pp,bool UseFullInt64Range)

{
  bool local_91;
  Int128 local_90;
  Int128 local_80;
  Int128 local_70;
  Int128 local_60;
  Int128 local_50;
  Int128 local_40;
  byte local_29;
  OutPt *pOStack_28;
  bool result;
  OutPt *pp2;
  OutPt *pOStack_18;
  bool UseFullInt64Range_local;
  OutPt *pp_local;
  IntPoint *pt_local;
  
  local_29 = 0;
  pOStack_28 = pp;
  pp2._7_1_ = UseFullInt64Range;
  pOStack_18 = pp;
  pp_local = (OutPt *)pt;
  if (UseFullInt64Range) {
    do {
      if ((((pOStack_28->pt).Y <= (pp_local->pt).X) && ((pp_local->pt).X < (pOStack_28->prev->pt).Y)
          ) || ((local_91 = false, (pOStack_28->prev->pt).Y <= (pp_local->pt).X &&
                (local_91 = false, (pp_local->pt).X < (pOStack_28->pt).Y)))) {
        Int128::Int128(&local_40,*(long *)pp_local - (pOStack_28->pt).X);
        Int128::Int128(&local_70,(pOStack_28->prev->pt).X - (pOStack_28->pt).X);
        Int128::Int128(&local_80,(pp_local->pt).X - (pOStack_28->pt).Y);
        Int128::operator*(&local_60,&local_70);
        Int128::Int128(&local_90,(pOStack_28->prev->pt).Y - (pOStack_28->pt).Y);
        Int128::operator/(&local_50,&local_60);
        local_91 = Int128::operator<(&local_40,&local_50);
      }
      if (local_91 != false) {
        local_29 = (local_29 ^ 0xff) & 1;
      }
      pOStack_28 = pOStack_28->next;
    } while (pOStack_28 != pOStack_18);
  }
  else {
    do {
      if (((((pOStack_28->pt).Y <= pt->Y) && (pt->Y < (pOStack_28->prev->pt).Y)) ||
          (((pOStack_28->prev->pt).Y <= pt->Y && (pt->Y < (pOStack_28->pt).Y)))) &&
         (pt->X < (((pOStack_28->prev->pt).X - (pOStack_28->pt).X) * (pt->Y - (pOStack_28->pt).Y)) /
                  ((pOStack_28->prev->pt).Y - (pOStack_28->pt).Y) + (pOStack_28->pt).X)) {
        local_29 = (local_29 ^ 0xff) & 1;
      }
      pOStack_28 = pOStack_28->next;
    } while (pOStack_28 != pp);
  }
  return (bool)(local_29 & 1);
}

Assistant:

bool PointInPolygon(const IntPoint &pt, OutPt *pp, bool UseFullInt64Range)
{
  OutPt *pp2 = pp;
  bool result = false;
  if (UseFullInt64Range) {
    do
    {
      if ((((pp2->pt.Y <= pt.Y) && (pt.Y < pp2->prev->pt.Y)) ||
          ((pp2->prev->pt.Y <= pt.Y) && (pt.Y < pp2->pt.Y))) &&
          Int128(pt.X - pp2->pt.X) < (Int128(pp2->prev->pt.X - pp2->pt.X) *
          Int128(pt.Y - pp2->pt.Y)) / Int128(pp2->prev->pt.Y - pp2->pt.Y))
            result = !result;
      pp2 = pp2->next;
    }
    while (pp2 != pp);
  }
  else
  {
    do
    {
      if ((((pp2->pt.Y <= pt.Y) && (pt.Y < pp2->prev->pt.Y)) ||
        ((pp2->prev->pt.Y <= pt.Y) && (pt.Y < pp2->pt.Y))) &&
        (pt.X < (pp2->prev->pt.X - pp2->pt.X) * (pt.Y - pp2->pt.Y) /
        (pp2->prev->pt.Y - pp2->pt.Y) + pp2->pt.X )) result = !result;
      pp2 = pp2->next;
    }
    while (pp2 != pp);
  }
  return result;
}